

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SkipComment
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp,bool *containTypeDef)

{
  byte bVar1;
  byte *end;
  code *pcVar2;
  bool bVar3;
  char16 cVar4;
  undefined4 *puVar5;
  EncodedCharPtr s;
  byte *pbVar6;
  byte *pbVar7;
  byte *local_38;
  uint ch;
  
  if (containTypeDef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x5a9,"(containTypeDef != nullptr)","containTypeDef != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pbVar7 = *pp;
  *containTypeDef = false;
  end = this->m_pchLast;
  do {
    while (pbVar6 = pbVar7, pbVar7 = pbVar6 + 1, local_38 = pbVar7, end <= pbVar6) {
LAB_00f030b7:
      if (end <= pbVar7) {
        this->m_currentCharacter = pbVar6;
        *pp = pbVar6;
        Error(this,-0x7ff5fc08);
      }
    }
    bVar1 = *pbVar6;
    ch = (uint)bVar1;
    if (bVar1 < 0xd) {
      if (bVar1 != 0) {
        if (bVar1 != 10) goto LAB_00f030d2;
        goto LAB_00f0310b;
      }
      goto LAB_00f030b7;
    }
    if (bVar1 == 0xd) {
LAB_00f0310b:
      this->m_fHadEol = 1;
      this->m_currentCharacter = local_38;
      ScanNewLine(this,ch);
      pbVar7 = this->m_currentCharacter;
    }
    else if (bVar1 == 0x2a) {
      if (*pbVar7 == 0x2f) {
        *pp = pbVar6 + 2;
        return tkNone;
      }
    }
    else {
LAB_00f030d2:
      if ((char)bVar1 < '\0') {
        cVar4 = utf8::DecodeTail((ushort)bVar1,&local_38,end,
                                 &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                                 (bool *)0x0);
        ch = (uint)(ushort)cVar4;
        (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
             (size_t)(local_38 +
                     ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits - (long)pbVar7));
        pbVar7 = local_38;
        if ((cVar4 & 0xfffeU) == 0x2028) goto LAB_00f0310b;
      }
    }
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::SkipComment(EncodedCharPtr *pp, /* out */ bool* containTypeDef)
{
    Assert(containTypeDef != nullptr);
    EncodedCharPtr p = *pp;
    *containTypeDef = false;
    EncodedCharPtr last = m_pchLast;
    OLECHAR ch;

    for (;;)
    {
        switch((ch = this->ReadFirst(p, last)))
        {
        case '*':
            if (*p == '/')
            {
                *pp = p + 1;
                return tkNone;
            }
            break;

        // ES 2015 11.3 Line Terminators
        case kchLS:         // 0x2028, classifies as new line
        case kchPS:         // 0x2029, classifies as new line
LEcmaLineBreak:
            goto LLineBreak;

        case kchRET:
        case kchNWL:
LLineBreak:
            m_fHadEol = TRUE;
            m_currentCharacter = p;
            ScanNewLine(ch);
            p = m_currentCharacter;
            break;

        case kchNUL:
            if (p >= last)
            {
                m_currentCharacter = p - 1;
                *pp = p - 1;
                Error(ERRnoCmtEnd);
            }
            break;

        default:
            if (this->IsMultiUnitChar(ch))
            {
                ch = this->template ReadRest<true>(ch, p, last);
                switch (ch)
                {
                case kchLS:
                case kchPS:
                    goto LEcmaLineBreak;
                }
            }
            break;
        }
    }
}